

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O3

int archive_read_support_format_iso9660(archive *_a)

{
  int iVar1;
  int iVar2;
  undefined8 *format_data;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_format_iso9660");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    format_data = (undefined8 *)calloc(1,0xa10);
    if (format_data == (undefined8 *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate iso9660 data");
    }
    else {
      *format_data = 0x196609660;
      format_data[0x11] = format_data + 0x10;
      format_data[0x13] = format_data + 0x12;
      *(undefined4 *)(format_data + 1) = 1;
      iVar2 = __archive_read_register_format
                        ((archive_read *)_a,format_data,"iso9660",archive_read_format_iso9660_bid,
                         archive_read_format_iso9660_options,archive_read_format_iso9660_read_header
                         ,archive_read_format_iso9660_read_data,
                         archive_read_format_iso9660_read_data_skip,
                         (_func_int64_t_archive_read_ptr_int64_t_int *)0x0,
                         archive_read_format_iso9660_cleanup,(_func_int_archive_read_ptr *)0x0,
                         (_func_int_archive_read_ptr *)0x0);
      if (iVar2 == 0) {
        iVar2 = 0;
      }
      else {
        free(format_data);
      }
    }
  }
  return iVar2;
}

Assistant:

int
archive_read_support_format_iso9660(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct iso9660 *iso9660;
	int r;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_iso9660");

	iso9660 = calloc(1, sizeof(*iso9660));
	if (iso9660 == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate iso9660 data");
		return (ARCHIVE_FATAL);
	}
	iso9660->magic = ISO9660_MAGIC;
	iso9660->cache_files.first = NULL;
	iso9660->cache_files.last = &(iso9660->cache_files.first);
	iso9660->re_files.first = NULL;
	iso9660->re_files.last = &(iso9660->re_files.first);
	/* Enable to support Joliet extensions by default.	*/
	iso9660->opt_support_joliet = 1;
	/* Enable to support Rock Ridge extensions by default.	*/
	iso9660->opt_support_rockridge = 1;

	r = __archive_read_register_format(a,
	    iso9660,
	    "iso9660",
	    archive_read_format_iso9660_bid,
	    archive_read_format_iso9660_options,
	    archive_read_format_iso9660_read_header,
	    archive_read_format_iso9660_read_data,
	    archive_read_format_iso9660_read_data_skip,
	    NULL,
	    archive_read_format_iso9660_cleanup,
	    NULL,
	    NULL);

	if (r != ARCHIVE_OK) {
		free(iso9660);
		return (r);
	}
	return (ARCHIVE_OK);
}